

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O2

void __thiscall
cmFileInstaller::ReportCopy(cmFileInstaller *this,string *toFile,Type type,bool copy)

{
  char *a;
  string message;
  string local_40;
  
  if (this->MessageNever == false) {
    if (copy) {
      a = "Installing: ";
    }
    else {
      if (this->MessageLazy != false) goto LAB_0034503b;
      a = "Up-to-date: ";
    }
    cmStrCat<char_const(&)[13],std::__cxx11::string_const&>(&local_40,(char (*) [13])a,toFile);
    cmMakefile::DisplayStatus((this->super_cmFileCopier).Makefile,&local_40,-1.0);
    std::__cxx11::string::~string((string *)&local_40);
  }
LAB_0034503b:
  if (type != TypeDir) {
    ManifestAppend(this,toFile);
  }
  return;
}

Assistant:

void cmFileInstaller::ReportCopy(const std::string& toFile, Type type,
                                 bool copy)
{
  if (!this->MessageNever && (copy || !this->MessageLazy)) {
    std::string message =
      cmStrCat((copy ? "Installing: " : "Up-to-date: "), toFile);
    this->Makefile->DisplayStatus(message, -1);
  }
  if (type != TypeDir) {
    // Add the file to the manifest.
    this->ManifestAppend(toFile);
  }
}